

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void sexp_emit_push(sexp_conflict ctx,sexp_conflict obj)

{
  sexp_conflict in_RSI;
  sexp_conflict in_RDI;
  sexp_conflict unaff_retaddr;
  sexp_conflict in_stack_ffffffffffffffe8;
  
  sexp_emit(unaff_retaddr,(uchar)((ulong)in_RDI >> 0x38));
  sexp_emit_word(unaff_retaddr,(sexp_uint_t)in_RDI);
  sexp_inc_context_depth(in_RDI,1);
  bytecode_preserve(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void sexp_emit_push (sexp ctx, sexp obj) {
  sexp_emit(ctx, SEXP_OP_PUSH);
  sexp_emit_word(ctx, (sexp_uint_t)obj);
  sexp_inc_context_depth(ctx, 1);
  bytecode_preserve(ctx, obj);
}